

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall
AmpIO::ReadDoutControl(AmpIO *this,uint index,uint16_t *countsHigh,uint16_t *countsLow)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  ostream *poVar4;
  undefined1 local_34 [4];
  uint channel;
  uint32_t read_data;
  uint16_t *countsLow_local;
  uint16_t *countsHigh_local;
  AmpIO *pAStack_18;
  uint index_local;
  AmpIO *this_local;
  
  *countsHigh = 0;
  *countsLow = 0;
  _channel = countsLow;
  countsLow_local = countsHigh;
  countsHigh_local._4_4_ = index;
  pAStack_18 = this;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 5) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "AmpIO::ReadDoutControl: requires firmware 5 or above");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x64524131) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "AmpIO::ReadDoutControl not implemented for dRAC");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else if ((((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) ||
             (this->NumDouts <= countsHigh_local._4_4_)) ||
            (pBVar1 = (this->super_FpgaIO).super_BoardIO.port,
            uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                               (ulong)((countsHigh_local._4_4_ + 1) * 0x10 | 8),local_34),
            (uVar3 & 1) == 0)) {
      this_local._7_1_ = false;
    }
    else {
      *_channel = local_34._2_2_;
      *countsLow_local = local_34._0_2_;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::ReadDoutControl(unsigned int index, uint16_t &countsHigh, uint16_t &countsLow)
{
    countsHigh = 0;
    countsLow = 0;
    if (GetFirmwareVersion() < 5) {
        std::cerr << "AmpIO::ReadDoutControl: requires firmware 5 or above" << std::endl;
        return false;
    }
    if (GetHardwareVersion() == dRA1_String) {
        std::cerr << "AmpIO::ReadDoutControl not implemented for dRAC" << std::endl;
        return false;
    }

    uint32_t read_data;
    unsigned int channel = (index+1) << 4;
    if (port && (index < NumDouts)) {
        if (port->ReadQuadlet(BoardId, channel | DOUT_CTRL_REG, read_data)) {
            // Starting with Version 1.3.0 of this library, we swap the high and low times
            // because the digital outputs are inverted in hardware.
            countsLow = static_cast<uint16_t>(read_data >> 16);
            countsHigh  = static_cast<uint16_t>(read_data);
            return true;
        }
    }
    return false;
}